

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O0

void Ivy_ObjPatchFanin0(Ivy_Man_t *p,Ivy_Obj_t *pObj,Ivy_Obj_t *pFaninNew)

{
  int iVar1;
  Ivy_Obj_t *pObj_00;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pFaninOld;
  Ivy_Obj_t *pFaninNew_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 == 0) {
    pObj_00 = Ivy_ObjFanin0(pObj);
    Ivy_ObjRefsDec(pObj_00);
    if (p->fFanout != 0) {
      Ivy_ObjDeleteFanout(p,pObj_00,pObj);
    }
    pObj->pFanin0 = pFaninNew;
    pIVar2 = Ivy_Regular(pFaninNew);
    Ivy_ObjRefsInc(pIVar2);
    if (p->fFanout != 0) {
      pIVar2 = Ivy_Regular(pFaninNew);
      Ivy_ObjAddFanout(p,pIVar2,pObj);
    }
    iVar1 = Ivy_ObjIsPi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Ivy_ObjIsConst1(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Ivy_ObjRefs(pObj_00);
        if (iVar1 == 0) {
          Ivy_ObjDelete_rec(p,pObj_00,1);
        }
      }
    }
    return;
  }
  __assert_fail("!Ivy_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyObj.c"
                ,0xe3,"void Ivy_ObjPatchFanin0(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_ObjPatchFanin0( Ivy_Man_t * p, Ivy_Obj_t * pObj, Ivy_Obj_t * pFaninNew )
{
    Ivy_Obj_t * pFaninOld;
    assert( !Ivy_IsComplement(pObj) );
    pFaninOld = Ivy_ObjFanin0(pObj);
    // decrement ref and remove fanout
    Ivy_ObjRefsDec( pFaninOld );
    if ( p->fFanout )
        Ivy_ObjDeleteFanout( p, pFaninOld, pObj );
    // update the fanin
    pObj->pFanin0 = pFaninNew;
    // increment ref and add fanout
    Ivy_ObjRefsInc( Ivy_Regular(pFaninNew) );
    if ( p->fFanout )
        Ivy_ObjAddFanout( p, Ivy_Regular(pFaninNew), pObj );
    // get rid of old fanin
    if ( !Ivy_ObjIsPi(pFaninOld) && !Ivy_ObjIsConst1(pFaninOld) && Ivy_ObjRefs(pFaninOld) == 0 )
        Ivy_ObjDelete_rec( p, pFaninOld, 1 );
}